

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state.hh
# Opt level: O2

vector<int,_std::allocator<int>_> * __thiscall
State::ghosts_in_position
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,State *this,Position *pos)

{
  pointer pGVar1;
  undefined8 in_RAX;
  uint i;
  uint uVar2;
  ulong uVar3;
  undefined8 uStack_38;
  
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  uVar2 = 0;
  uStack_38 = in_RAX;
  while( true ) {
    uVar3 = (ulong)uVar2;
    pGVar1 = (this->ghosts).super__Vector_base<Ghost_State,_std::allocator<Ghost_State>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((ulong)(((long)(this->ghosts).super__Vector_base<Ghost_State,_std::allocator<Ghost_State>_>.
                       _M_impl.super__Vector_impl_data._M_finish - (long)pGVar1) / 0x44) <= uVar3)
    break;
    if ((pGVar1[uVar3].super_Agent_State.pos.i == pos->i) &&
       (pGVar1[uVar3].super_Agent_State.pos.j == pos->j)) {
      uStack_38 = CONCAT44(uVar2,(undefined4)uStack_38);
      std::vector<int,_std::allocator<int>_>::emplace_back<int>
                (__return_storage_ptr__,(int *)((long)&uStack_38 + 4));
    }
    uVar2 = uVar2 + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

inline vector<int> ghosts_in_position(const Position& pos) const {
        vector<int> ghosts_pos;

        for (uint i = 0; i < ghosts.size(); ++i) {
            if (ghosts[i].pos.i == pos.i and ghosts[i].pos.j == pos.j)
                ghosts_pos.push_back(i);
        }

        return ghosts_pos;
    }